

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionElasticPdu.cpp
# Opt level: O2

bool __thiscall
DIS::CollisionElasticPdu::operator==(CollisionElasticPdu *this,CollisionElasticPdu *rhs)

{
  float fVar1;
  float fVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  
  bVar5 = EntityInformationFamilyPdu::operator==
                    (&this->super_EntityInformationFamilyPdu,&rhs->super_EntityInformationFamilyPdu)
  ;
  bVar6 = EntityID::operator==(&this->_issuingEntityID,&rhs->_issuingEntityID);
  bVar7 = EntityID::operator==(&this->_collidingEntityID,&rhs->_collidingEntityID);
  bVar8 = EventIdentifier::operator==(&this->_collisionEventID,&rhs->_collisionEventID);
  sVar3 = this->_pad;
  sVar4 = rhs->_pad;
  bVar9 = Vector3Float::operator==(&this->_contactVelocity,&rhs->_contactVelocity);
  if ((this->_mass != rhs->_mass) || (NAN(this->_mass) || NAN(rhs->_mass))) {
    bVar9 = false;
  }
  else {
    bVar9 = bVar9 && (((bVar8 && bVar7) && (bVar5 && bVar6)) && sVar3 == sVar4);
  }
  bVar5 = Vector3Float::operator==(&this->_locationOfImpact,&rhs->_locationOfImpact);
  if ((this->_collisionIntermediateResultXX != rhs->_collisionIntermediateResultXX) ||
     (NAN(this->_collisionIntermediateResultXX) || NAN(rhs->_collisionIntermediateResultXX))) {
    bVar10 = 0;
  }
  else {
    bVar10 = bVar5 & bVar9;
  }
  if ((this->_collisionIntermediateResultXZ != rhs->_collisionIntermediateResultXZ) ||
     (NAN(this->_collisionIntermediateResultXZ) || NAN(rhs->_collisionIntermediateResultXZ))) {
    bVar10 = 0;
  }
  else {
    bVar10 = this->_collisionIntermediateResultXY == rhs->_collisionIntermediateResultXY & bVar10;
  }
  if ((this->_collisionIntermediateResultYZ != rhs->_collisionIntermediateResultYZ) ||
     (NAN(this->_collisionIntermediateResultYZ) || NAN(rhs->_collisionIntermediateResultYZ))) {
    bVar10 = 0;
  }
  else {
    bVar10 = this->_collisionIntermediateResultYY == rhs->_collisionIntermediateResultYY & bVar10;
  }
  fVar1 = this->_collisionIntermediateResultZZ;
  fVar2 = rhs->_collisionIntermediateResultZZ;
  bVar5 = Vector3Float::operator==(&this->_unitSurfaceNormal,&rhs->_unitSurfaceNormal);
  return (bool)(((bVar5 && fVar1 == fVar2) &&
                this->_coefficientOfRestitution == rhs->_coefficientOfRestitution) & bVar10);
}

Assistant:

bool CollisionElasticPdu::operator ==(const CollisionElasticPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_issuingEntityID == rhs._issuingEntityID) ) ivarsEqual = false;
     if( ! (_collidingEntityID == rhs._collidingEntityID) ) ivarsEqual = false;
     if( ! (_collisionEventID == rhs._collisionEventID) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;
     if( ! (_contactVelocity == rhs._contactVelocity) ) ivarsEqual = false;
     if( ! (_mass == rhs._mass) ) ivarsEqual = false;
     if( ! (_locationOfImpact == rhs._locationOfImpact) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXX == rhs._collisionIntermediateResultXX) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXY == rhs._collisionIntermediateResultXY) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultXZ == rhs._collisionIntermediateResultXZ) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultYY == rhs._collisionIntermediateResultYY) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultYZ == rhs._collisionIntermediateResultYZ) ) ivarsEqual = false;
     if( ! (_collisionIntermediateResultZZ == rhs._collisionIntermediateResultZZ) ) ivarsEqual = false;
     if( ! (_unitSurfaceNormal == rhs._unitSurfaceNormal) ) ivarsEqual = false;
     if( ! (_coefficientOfRestitution == rhs._coefficientOfRestitution) ) ivarsEqual = false;

    return ivarsEqual;
 }